

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::write_enum_id(CTcDataStream *this,ulong enum_id)

{
  if (G_keep_enumfixups != 0) {
    CTcIdFixup::add_fixup(&G_enumfixup,this,this->ofs_,enum_id);
  }
  write4(this,enum_id);
  return;
}

Assistant:

void CTcDataStream::write_enum_id(ulong enum_id)
{
    /* if there's a fixup list, add this reference */
    if (G_keep_enumfixups)
        CTcIdFixup::add_fixup(&G_enumfixup, this, get_ofs(), enum_id);

    /* write the ID */
    write4(enum_id);
}